

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O2

vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
* embree::SceneGraph::transformMSMBlurVec3faBuffer
            (vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
             *__return_storage_ptr__,
            vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            *positions_in,Transformations *spaces)

{
  float *pfVar1;
  Vector *pVVar2;
  Vector *pVVar3;
  Vector *pVVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  pointer pvVar8;
  size_t sVar9;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar10;
  Vec3fa *pVVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  size_t sVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  bool bVar28;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> local_98;
  AffineSpace3ff space;
  
  (__return_storage_ptr__->
  super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar8 = (positions_in->
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar25 = (long)(positions_in->
                 super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar8;
  sVar9 = pvVar8->size_active;
  if (lVar25 == 0x20) {
    for (uVar26 = 0; uVar26 < (spaces->spaces).size_active; uVar26 = uVar26 + 1) {
      space.l.vy.field_0._8_8_ = 0;
      space.l.vx.field_0._8_8_ = 0;
      space.l.vy.field_0._0_8_ = 0;
      if (sVar9 != 0) {
        space.l.vy.field_0._8_8_ = alignedMalloc(sVar9 << 4,0x10);
        space.l.vy.field_0._0_8_ = sVar9;
      }
      lVar25 = 0;
      sVar24 = sVar9;
      while (bVar28 = sVar24 != 0, sVar24 = sVar24 - 1, bVar28) {
        pAVar10 = (spaces->spaces).items;
        pVVar11 = ((positions_in->
                   super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start)->items;
        fVar5 = *(float *)((long)&pVVar11->field_0 + lVar25);
        fVar6 = *(float *)((long)&pVVar11->field_0 + lVar25 + 4);
        fVar7 = *(float *)((long)&pVVar11->field_0 + lVar25 + 8);
        pVVar2 = &pAVar10[uVar26].l.vz;
        fVar12 = (pVVar2->field_0).m128[1];
        fVar13 = (pVVar2->field_0).m128[2];
        fVar14 = (pVVar2->field_0).m128[3];
        pVVar3 = &pAVar10[uVar26].p;
        fVar15 = (pVVar3->field_0).m128[1];
        fVar16 = (pVVar3->field_0).m128[2];
        fVar17 = (pVVar3->field_0).m128[3];
        pVVar4 = &pAVar10[uVar26].l.vy;
        fVar18 = (pVVar4->field_0).m128[1];
        fVar19 = (pVVar4->field_0).m128[2];
        fVar20 = (pVVar4->field_0).m128[3];
        pAVar10 = pAVar10 + uVar26;
        fVar21 = (pAVar10->l).vx.field_0.m128[1];
        fVar22 = (pAVar10->l).vx.field_0.m128[2];
        fVar23 = (pAVar10->l).vx.field_0.m128[3];
        pfVar1 = (float *)(space.l.vy.field_0._8_8_ + lVar25);
        *pfVar1 = fVar5 * (pAVar10->l).vx.field_0.m128[0] +
                  fVar6 * (pVVar4->field_0).m128[0] +
                  fVar7 * (pVVar2->field_0).m128[0] + (pVVar3->field_0).m128[0];
        pfVar1[1] = fVar5 * fVar21 + fVar6 * fVar18 + fVar7 * fVar12 + fVar15;
        pfVar1[2] = fVar5 * fVar22 + fVar6 * fVar19 + fVar7 * fVar13 + fVar16;
        pfVar1[3] = fVar5 * fVar23 + fVar6 * fVar20 + fVar7 * fVar14 + fVar17;
        lVar25 = lVar25 + 0x10;
      }
      space.l.vx.field_0._8_8_ = space.l.vy.field_0._0_8_;
      std::
      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                  *)__return_storage_ptr__,
                 (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                 &space);
      alignedFree((void *)space.l.vy.field_0._8_8_);
    }
  }
  else {
    uVar26 = lVar25 >> 5;
    for (uVar27 = 0; uVar27 != uVar26; uVar27 = uVar27 + 1) {
      Transformations::interpolate(&space,spaces,(float)uVar27 / (float)(uVar26 - 1));
      local_98.items = (Vec3fa *)0x0;
      local_98.size_active = 0;
      local_98.size_alloced = 0;
      if (sVar9 != 0) {
        local_98.items = (Vec3fa *)alignedMalloc(sVar9 << 4,0x10);
        local_98.size_alloced = sVar9;
      }
      lVar25 = 0;
      sVar24 = sVar9;
      while (bVar28 = sVar24 != 0, sVar24 = sVar24 - 1, bVar28) {
        pVVar11 = (positions_in->
                  super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[uVar27].items;
        fVar5 = *(float *)((long)&pVVar11->field_0 + lVar25);
        fVar6 = *(float *)((long)&pVVar11->field_0 + lVar25 + 4);
        fVar7 = *(float *)((long)&pVVar11->field_0 + lVar25 + 8);
        pfVar1 = (float *)((long)&(local_98.items)->field_0 + lVar25);
        *pfVar1 = fVar5 * space.l.vx.field_0.m128[0] +
                  fVar6 * space.l.vy.field_0.m128[0] +
                  fVar7 * space.l.vz.field_0.m128[0] + space.p.field_0.m128[0];
        pfVar1[1] = fVar5 * space.l.vx.field_0.m128[1] +
                    fVar6 * space.l.vy.field_0.m128[1] +
                    fVar7 * space.l.vz.field_0.m128[1] + space.p.field_0.m128[1];
        pfVar1[2] = fVar5 * space.l.vx.field_0.m128[2] +
                    fVar6 * space.l.vy.field_0.m128[2] +
                    fVar7 * space.l.vz.field_0.m128[2] + space.p.field_0.m128[2];
        pfVar1[3] = fVar5 * space.l.vx.field_0.m128[3] +
                    fVar6 * space.l.vy.field_0.m128[3] +
                    fVar7 * space.l.vz.field_0.m128[3] + space.p.field_0.m128[3];
        lVar25 = lVar25 + 0x10;
      }
      local_98.size_active = local_98.size_alloced;
      std::
      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                  *)__return_storage_ptr__,&local_98);
      alignedFree(local_98.items);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<avector<Vec3fa>> transformMSMBlurVec3faBuffer(const std::vector<avector<Vec3fa>>& positions_in, const Transformations& spaces)
    {
      std::vector<avector<Vec3fa>> positions_out;
      const size_t num_time_steps = positions_in.size(); assert(num_time_steps);
      const size_t num_vertices = positions_in[0].size();

      /* if we have only one set of vertices, use transformation to generate more vertex sets */
      if (num_time_steps == 1)
      {
        for (size_t i=0; i<spaces.size(); i++) 
        {
          avector<Vec3fa> verts(num_vertices);
          for (size_t j=0; j<num_vertices; j++) {
            verts[j] = xfmPoint((AffineSpace3fa)spaces[i],positions_in[0][j]);
          }
          positions_out.push_back(std::move(verts));
        }
      } 
      /* otherwise transform all vertex sets with interpolated transformation */
      else
      {
        for (size_t t=0; t<num_time_steps; t++) 
        {
          float time = num_time_steps > 1 ? float(t)/float(num_time_steps-1) : 0.0f;
          const AffineSpace3ff space = spaces.interpolate(time);
          avector<Vec3fa> verts(num_vertices);
          for (size_t i=0; i<num_vertices; i++) {
            verts[i] = xfmPoint ((AffineSpace3fa)space,positions_in[t][i]);
          }
          positions_out.push_back(std::move(verts));
        }
      }
      return positions_out;
    }